

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O2

LispPTR STRING_EQUAL_HASHBITS(LispPTR object)

{
  ushort uVar1;
  LispPTR *pLVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = *(ushort *)((ulong)((object >> 9) * 2) + (long)MDStypetbl ^ 2) & 0x7ff;
  if (uVar1 == 0x15) {
LAB_0012b5cf:
    uVar7 = object & 0xfffffff;
    if ((object & 0xfff0000) == 0) {
      puVar3 = (uint *)(AtomSpace + (ulong)(uVar7 * 5) * 2);
      uVar6 = (ulong)((*puVar3 & 0xfffffff) * 2) + (long)Lisp_world;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(uVar7);
      uVar6 = (ulong)((*pLVar2 & 0xfffffff) * 2) + (long)Lisp_world;
      puVar3 = NativeAligned4FromLAddr(uVar7);
    }
    uVar5 = (uint)((ulong)*(undefined8 *)(puVar3 + 3) >> 0x2d) & 1;
    uVar7 = (uint)*(byte *)(uVar6 ^ 3);
    uVar4 = 1;
  }
  else {
    if ((uVar1 != 0xe) && (uVar1 != 0x10)) {
      if (uVar1 != 4) {
LAB_0012b617:
        uVar5 = object >> 9 & 0x7f ^ object << 3 ^ object >> 0x10;
        goto LAB_0012b628;
      }
      goto LAB_0012b5cf;
    }
    pLVar2 = NativeAligned4FromLAddr(object);
    if ((*(ushort *)((long)pLVar2 + 6) >> 0xc & 1) == 0) goto LAB_0012b617;
    uVar5 = (uint)((char)*(ushort *)((long)pLVar2 + 6) == 'D');
    uVar6 = (ulong)((*pLVar2 & 0xfffffff) * 2) + (long)Lisp_world;
    uVar4 = (ulong)(ushort)pLVar2[1];
    uVar7 = pLVar2[2];
  }
  if (uVar5 == 0) {
    uVar4 = uVar4 + uVar6;
    uVar5 = 0;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      uVar5 = (uVar5 + (uVar5 & 0xfff) * 4) * 0x101 + (*(byte *)(uVar4 ^ 3) | 0x20);
      uVar4 = uVar4 + 1;
    }
  }
  else {
    uVar6 = uVar6 + uVar4 * 2;
    uVar5 = 0;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      uVar5 = (uVar5 + (uVar5 & 0xfff) * 4) * 0x101 + (*(ushort *)(uVar6 ^ 2) | 0x20);
      uVar6 = uVar6 + 2;
    }
  }
LAB_0012b628:
  return uVar5 & 0xffff | 0xe0000;
}

Assistant:

LispPTR STRING_EQUAL_HASHBITS(LispPTR object) {
  return (S_POSITIVE | (0xFFFF & (stringequalhash(object))));
}